

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_ecmult_constants_sha(uint32_t prefix,size_t iter,uchar *expected32)

{
  undefined1 *puVar1;
  int iVar2;
  secp256k1_scratch *psVar3;
  long lVar4;
  ulong uVar5;
  code *pcVar6;
  secp256k1_scalar *psVar7;
  secp256k1_scalar *psVar8;
  secp256k1_scratch *scratch;
  size_t sVar9;
  secp256k1_gej *r;
  ulong uVar10;
  secp256k1_scalar *psVar11;
  secp256k1_sha256 *psVar12;
  secp256k1_ge *elem;
  code *cb;
  secp256k1_sha256 *hash;
  size_t sVar13;
  secp256k1_sha256 *psVar14;
  uchar inp [6];
  uchar b32 [32];
  ulong uStack_1578;
  secp256k1_strauss_state sStack_1570;
  secp256k1_fe asStack_1558 [8];
  secp256k1_strauss_point_state sStack_1418;
  secp256k1_ge asStack_1008 [8];
  size_t *psStack_d40;
  secp256k1_gej *psStack_d38;
  secp256k1_gej *psStack_d30;
  secp256k1_sha256 *psStack_d28;
  secp256k1_gej *psStack_d20;
  secp256k1_strauss_point_state *psStack_d18;
  size_t sStack_cf8;
  secp256k1_scalar sStack_cf0;
  secp256k1_scratch asStack_cd0 [2];
  secp256k1_ge sStack_c88;
  secp256k1_gej sStack_c30;
  secp256k1_gej sStack_bb0;
  secp256k1_gej sStack_b30;
  secp256k1_gej sStack_ab0;
  secp256k1_gej sStack_a30;
  secp256k1_gej asStack_9b0 [2];
  secp256k1_gej asStack_870 [5];
  secp256k1_strauss_point_state sStack_5b0;
  secp256k1_scratch *psStack_198;
  secp256k1_sha256 *psStack_190;
  secp256k1_scalar *psStack_188;
  size_t sStack_180;
  size_t sStack_178;
  secp256k1_scalar *psStack_170;
  uint32_t local_15e;
  undefined2 local_15a;
  size_t local_158;
  uchar *local_150;
  secp256k1_scalar local_148;
  secp256k1_scalar local_128;
  secp256k1_sha256 local_108;
  secp256k1_sha256 local_98;
  
  psVar11 = (secp256k1_scalar *)(ulong)prefix;
  psStack_170 = (secp256k1_scalar *)0x163319;
  local_158 = iter;
  local_150 = expected32;
  psVar3 = secp256k1_scratch_create(&CTX->error_callback,0x10000);
  psVar14 = &local_98;
  local_98.s[0] = 0x6a09e667;
  local_98.s[1] = 0xbb67ae85;
  local_98.s[2] = 0x3c6ef372;
  local_98.s[3] = 0xa54ff53a;
  local_98.s[4] = 0x510e527f;
  local_98.s[5] = 0x9b05688c;
  local_98.s[6] = 0x1f83d9ab;
  local_98.s[7] = 0x5be0cd19;
  sVar13 = 0;
  local_98.bytes = 0;
  local_128.d[0] = 0;
  local_128.d[1] = 0;
  local_128.d[2] = 0;
  local_128.d[3] = 0;
  psStack_170 = (secp256k1_scalar *)0x163369;
  local_15e = prefix;
  test_ecmult_accumulate(psVar14,&local_128,psVar3);
  local_128.d[0] = 1;
  local_128.d[1] = 0;
  local_128.d[2] = 0;
  local_128.d[3] = 0;
  psStack_170 = (secp256k1_scalar *)0x16338b;
  test_ecmult_accumulate(psVar14,&local_128,psVar3);
  psStack_170 = (secp256k1_scalar *)0x163396;
  secp256k1_scalar_negate(&local_128,&local_128);
  psStack_170 = (secp256k1_scalar *)0x1633a7;
  test_ecmult_accumulate(psVar14,&local_128,psVar3);
  sVar9 = local_158;
  if (local_158 != 0) {
    sVar13 = 0;
    psVar14 = &local_108;
    psVar11 = &local_148;
    do {
      local_15a = (undefined2)sVar13;
      local_108.s[0] = 0x6a09e667;
      local_108.s[1] = 0xbb67ae85;
      local_108.s[2] = 0x3c6ef372;
      local_108.s[3] = 0xa54ff53a;
      local_108.s[4] = 0x510e527f;
      local_108.s[5] = 0x9b05688c;
      local_108.s[6] = 0x1f83d9ab;
      local_108.s[7] = 0x5be0cd19;
      local_108.bytes = 0;
      psStack_170 = (secp256k1_scalar *)0x163403;
      secp256k1_sha256_write(psVar14,(uchar *)&local_15e,6);
      psStack_170 = (secp256k1_scalar *)0x16340e;
      secp256k1_sha256_finalize(psVar14,(uchar *)psVar11);
      psStack_170 = (secp256k1_scalar *)0x16341b;
      secp256k1_scalar_set_b32(&local_128,(uchar *)psVar11,(int *)0x0);
      psStack_170 = (secp256k1_scalar *)0x16342e;
      test_ecmult_accumulate(&local_98,&local_128,psVar3);
      sVar13 = sVar13 + 1;
    } while (sVar9 != sVar13);
  }
  hash = &local_98;
  psVar7 = &local_148;
  psStack_170 = (secp256k1_scalar *)0x163448;
  secp256k1_sha256_finalize(hash,(uchar *)psVar7);
  lVar4 = 0;
  while (*(uchar *)((long)local_148.d + lVar4) == local_150[lVar4]) {
    lVar4 = lVar4 + 1;
    if (lVar4 == 0x20) {
      psStack_170 = (secp256k1_scalar *)0x163475;
      secp256k1_scratch_destroy(&CTX->error_callback,psVar3);
      return;
    }
  }
  psStack_170 = (secp256k1_scalar *)test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  sStack_178 = sVar9;
  sStack_cf0.d[2] = 0;
  sStack_cf0.d[3] = 0;
  sStack_cf0.d[0] = 0;
  sStack_cf0.d[1] = 0;
  sStack_cf8 = 0x41;
  sStack_a30.infinity = 0;
  sStack_a30.x.n[0] = 0x2815b16f81798;
  sStack_a30.x.n[1] = 0xdb2dce28d959f;
  sStack_a30.x.n[2] = 0xe870b07029bfc;
  sStack_a30.x.n[3] = 0xbbac55a06295c;
  sStack_a30.x.n[4] = 0x79be667ef9dc;
  sStack_a30.y.n[4] = 0x483ada7726a3;
  sStack_a30.y.n[0] = 0x7d08ffb10d4b8;
  sStack_a30.y.n[1] = 0x48a68554199c4;
  sStack_a30.y.n[2] = 0xe1108a8fd17b4;
  sStack_a30.y.n[3] = 0xc4655da4fbfc0;
  sStack_a30.z.n[0] = 1;
  sStack_a30.z.n[3] = 0;
  sStack_a30.z.n[4] = 0;
  sStack_a30.z.n[1] = 0;
  sStack_a30.z.n[2] = 0;
  sStack_ab0.infinity = 1;
  sStack_ab0.z.n[4] = 0;
  sStack_ab0.z.n[2] = 0;
  sStack_ab0.z.n[3] = 0;
  sStack_ab0.z.n[0] = 0;
  sStack_ab0.z.n[1] = 0;
  sStack_ab0.y.n[3] = 0;
  sStack_ab0.y.n[4] = 0;
  sStack_ab0.y.n[1] = 0;
  sStack_ab0.y.n[2] = 0;
  sStack_ab0.x.n[4] = 0;
  sStack_ab0.y.n[0] = 0;
  sStack_ab0.x.n[2] = 0;
  sStack_ab0.x.n[3] = 0;
  sStack_ab0.x.n[0] = 0;
  sStack_ab0.x.n[1] = 0;
  psStack_d18 = (secp256k1_strauss_point_state *)0x163571;
  psStack_198 = psVar3;
  psStack_190 = psVar14;
  psStack_188 = &local_128;
  sStack_180 = sVar13;
  psStack_170 = psVar11;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_b30,psVar7);
  psStack_d18 = (secp256k1_strauss_point_state *)0x1635bc;
  sStack_c30.x.n[0] = (uint64_t)asStack_9b0;
  sStack_c30.x.n[1] = (uint64_t)asStack_870;
  sStack_c30.x.n[2] = (uint64_t)&sStack_5b0;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_c30,&sStack_bb0,1,&sStack_a30,psVar7,&sStack_cf0);
  psStack_d18 = (secp256k1_strauss_point_state *)0x1635ed;
  sStack_c88.x.n[0] = (uint64_t)asStack_9b0;
  sStack_c88.x.n[1] = (uint64_t)asStack_870;
  sStack_c88.x.n[2] = (uint64_t)&sStack_5b0;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_c88,&sStack_c30,1,&sStack_ab0,&sStack_cf0,psVar7);
  psStack_d18 = (secp256k1_strauss_point_state *)0x163616;
  secp256k1_ecmult_multi_var
            ((secp256k1_callback *)0x0,scratch,(secp256k1_gej *)&sStack_5b0,psVar7,
             (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  cb = test_ecmult_accumulate_cb;
  psStack_d18 = (secp256k1_strauss_point_state *)0x163641;
  psVar11 = psVar7;
  secp256k1_ecmult_multi_var
            ((secp256k1_callback *)0x0,scratch,asStack_870,&sStack_cf0,test_ecmult_accumulate_cb,
             psVar7,1);
  psStack_d18 = (secp256k1_strauss_point_state *)0x16365b;
  secp256k1_ecmult_const(asStack_9b0,&secp256k1_ge_const_g,psVar7);
  psStack_d18 = (secp256k1_strauss_point_state *)0x163673;
  secp256k1_ge_set_gej_var(&sStack_c88,&sStack_b30);
  psStack_d18 = (secp256k1_strauss_point_state *)0x163683;
  ge_equals_gej(&sStack_c88,&sStack_bb0);
  psStack_d18 = (secp256k1_strauss_point_state *)0x16368e;
  ge_equals_gej(&sStack_c88,&sStack_c30);
  psStack_d18 = (secp256k1_strauss_point_state *)0x163699;
  ge_equals_gej(&sStack_c88,(secp256k1_gej *)&sStack_5b0);
  psStack_d18 = (secp256k1_strauss_point_state *)0x1636a4;
  ge_equals_gej(&sStack_c88,asStack_870);
  psStack_d18 = (secp256k1_strauss_point_state *)0x1636af;
  ge_equals_gej(&sStack_c88,asStack_9b0);
  if (sStack_c88.infinity == 0) {
    elem = &sStack_c88;
    psVar3 = asStack_cd0;
    psVar7 = (secp256k1_scalar *)0x0;
    psStack_d18 = (secp256k1_strauss_point_state *)0x1636eb;
    secp256k1_eckey_pubkey_serialize(elem,psVar3->magic,&sStack_cf8,0);
    if (sStack_cf8 != 0x41) {
      psStack_d18 = (secp256k1_strauss_point_state *)secp256k1_ecmult_multi_var;
      test_ecmult_accumulate_cold_1();
      r->infinity = 1;
      (r->x).n[0] = 0;
      (r->x).n[1] = 0;
      (r->x).n[2] = 0;
      (r->x).n[3] = 0;
      (r->x).n[4] = 0;
      (r->y).n[0] = 0;
      (r->y).n[1] = 0;
      (r->y).n[2] = 0;
      (r->y).n[3] = 0;
      (r->y).n[4] = 0;
      (r->z).n[0] = 0;
      (r->z).n[1] = 0;
      (r->z).n[2] = 0;
      (r->z).n[3] = 0;
      (r->z).n[4] = 0;
      if (psVar7 != (secp256k1_scalar *)0x0 || hash != (secp256k1_sha256 *)0x0) {
        psStack_d40 = &sStack_cf8;
        psStack_d38 = &sStack_c30;
        psStack_d30 = asStack_870;
        psStack_d28 = hash;
        psStack_d20 = asStack_9b0;
        psStack_d18 = &sStack_5b0;
        if (hash == (secp256k1_sha256 *)0x0) {
          sStack_1570.aux = asStack_1558;
          sStack_1570.pre_a = asStack_1008;
          sStack_1570.ps = &sStack_1418;
          secp256k1_ecmult_strauss_wnaf(&sStack_1570,r,1,r,&secp256k1_scalar_zero,psVar7);
        }
        else {
          if ((psVar3 == (secp256k1_scratch *)0x0) ||
             (sVar9 = secp256k1_pippenger_max_points((secp256k1_callback *)elem,psVar3), sVar9 == 0)
             ) {
LAB_0016396f:
            secp256k1_ecmult_multi_simple_var(r,psVar7,cb,psVar11,(size_t)hash);
            return;
          }
          uVar5 = 5000000;
          if (sVar9 < 5000000) {
            uVar5 = sVar9;
          }
          puVar1 = (undefined1 *)((long)&hash[-1].bytes + 7);
          uStack_1578 = (ulong)puVar1 / uVar5 + 1;
          uVar5 = (ulong)puVar1 / uStack_1578;
          if (uVar5 < 0x57) {
            lVar4 = 0;
            do {
              if (psVar3->magic[lVar4] != "scratch"[lVar4]) {
                (*(code *)(elem->x).n[0])("invalid scratch space",(elem->x).n[1]);
                goto LAB_0016396f;
              }
              lVar4 = lVar4 + 1;
            } while (lVar4 != 8);
            uVar10 = psVar3->max_size - psVar3->alloc_size;
            uVar5 = 0;
            if (0x4a < uVar10) {
              uVar5 = uVar10 - 0x4b;
            }
            if (uVar5 < 0x8b0) goto LAB_0016396f;
            uVar5 = uVar5 / 0x8b0;
            if (4999999 < uVar5) {
              uVar5 = 5000000;
            }
            uStack_1578 = (ulong)puVar1 / uVar5 + 1;
            uVar5 = (ulong)puVar1 / uStack_1578;
            pcVar6 = secp256k1_ecmult_strauss_batch;
          }
          else {
            pcVar6 = secp256k1_ecmult_pippenger_batch;
          }
          psVar14 = (secp256k1_sha256 *)(uVar5 + 1);
          lVar4 = 0;
          uVar5 = 0;
          do {
            psVar12 = psVar14;
            if (hash < psVar14) {
              psVar12 = hash;
            }
            psVar8 = (secp256k1_scalar *)0x0;
            if (uVar5 == 0) {
              psVar8 = psVar7;
            }
            iVar2 = (*pcVar6)(elem,psVar3,&sStack_1418,psVar8,cb,psVar11,psVar12,lVar4);
            if (iVar2 == 0) {
              return;
            }
            secp256k1_gej_add_var(r,r,(secp256k1_gej *)&sStack_1418,(secp256k1_fe *)0x0);
            hash = (secp256k1_sha256 *)((long)hash - (long)psVar12);
            uVar5 = uVar5 + 1;
            lVar4 = (long)psVar14->s + lVar4;
          } while (uStack_1578 != uVar5);
        }
      }
      return;
    }
    sVar9 = 0x41;
  }
  else {
    asStack_cd0[0].magic[0] = '\0';
    sVar9 = 1;
  }
  psStack_d18 = (secp256k1_strauss_point_state *)0x163703;
  secp256k1_sha256_write(hash,asStack_cd0[0].magic,sVar9);
  return;
}

Assistant:

static void test_ecmult_constants_sha(uint32_t prefix, size_t iter, const unsigned char* expected32) {
    /* Using test_ecmult_accumulate, test ecmult for:
     * - Key 0
     * - Key 1
     * - Key -1
     * - For i in range(iter):
     *   - Key SHA256(LE32(prefix) || LE16(i))
     */
    secp256k1_scalar x;
    secp256k1_sha256 acc;
    unsigned char b32[32];
    unsigned char inp[6];
    size_t i;
    secp256k1_scratch_space *scratch = secp256k1_scratch_space_create(CTX, 65536);

    inp[0] = prefix & 0xFF;
    inp[1] = (prefix >> 8) & 0xFF;
    inp[2] = (prefix >> 16) & 0xFF;
    inp[3] = (prefix >> 24) & 0xFF;
    secp256k1_sha256_initialize(&acc);
    secp256k1_scalar_set_int(&x, 0);
    test_ecmult_accumulate(&acc, &x, scratch);
    secp256k1_scalar_set_int(&x, 1);
    test_ecmult_accumulate(&acc, &x, scratch);
    secp256k1_scalar_negate(&x, &x);
    test_ecmult_accumulate(&acc, &x, scratch);

    for (i = 0; i < iter; ++i) {
        secp256k1_sha256 gen;
        inp[4] = i & 0xff;
        inp[5] = (i >> 8) & 0xff;
        secp256k1_sha256_initialize(&gen);
        secp256k1_sha256_write(&gen, inp, sizeof(inp));
        secp256k1_sha256_finalize(&gen, b32);
        secp256k1_scalar_set_b32(&x, b32, NULL);
        test_ecmult_accumulate(&acc, &x, scratch);
    }
    secp256k1_sha256_finalize(&acc, b32);
    CHECK(secp256k1_memcmp_var(b32, expected32, 32) == 0);

    secp256k1_scratch_space_destroy(CTX, scratch);
}